

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isDistinctRedundant(Parse *pParse,SrcList *pTabList,WhereClause *pWC,ExprList *pDistinct)

{
  short sVar1;
  int iCur;
  Index *pIdx;
  char *pcVar2;
  Expr *pEVar3;
  int iVar4;
  WhereTerm *pWVar5;
  CollSeq *pCVar6;
  ExprList_item *pEVar7;
  long lVar8;
  long lVar9;
  Expr *pEVar10;
  ulong uVar11;
  byte bVar12;
  
  if (pTabList->nSrc == 1) {
    iCur = pTabList->a[0].iCursor;
    if (0 < (long)pDistinct->nExpr) {
      lVar9 = 0;
      do {
        pEVar10 = pDistinct->a[lVar9].pExpr;
        while (pEVar10 != (Expr *)0x0) {
          if ((pEVar10->flags & 0x82000) == 0) {
            if ((((pEVar10->op == 0xa9) || (pEVar10->op == 0xa7)) && (pEVar10->iTable == iCur)) &&
               (pEVar10->iColumn < 0)) {
              return 1;
            }
            break;
          }
          if ((pEVar10->flags >> 0x13 & 1) == 0) {
            pEVar7 = (ExprList_item *)&pEVar10->pLeft;
          }
          else {
            pEVar7 = ((pEVar10->x).pList)->a;
          }
          pEVar10 = pEVar7->pExpr;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != pDistinct->nExpr);
    }
    for (pIdx = (pTabList->a[0].pTab)->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
      if ((pIdx->onError != '\0') && (pIdx->pPartIdxWhere == (Expr *)0x0)) {
        if (pIdx->nKeyCol == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          do {
            pWVar5 = sqlite3WhereFindTerm(pWC,iCur,(int)uVar11,0xffffffffffffffff,2,pIdx);
            if (pWVar5 == (WhereTerm *)0x0) {
              iVar4 = pDistinct->nExpr;
              if (0 < iVar4) {
                pcVar2 = pIdx->azColl[uVar11];
                lVar9 = 0;
LAB_0019ceb9:
                pEVar10 = pDistinct->a[lVar9].pExpr;
                pEVar3 = pEVar10;
                while (pEVar3 != (Expr *)0x0) {
                  if ((pEVar3->flags & 0x82000) == 0) {
                    if (((pEVar3->op == 0xa9) || (pEVar3->op == 0xa7)) &&
                       ((pEVar3->iColumn == pIdx->aiColumn[uVar11] && (pEVar3->iTable == iCur)))) {
                      pCVar6 = sqlite3ExprCollSeq(pParse,pEVar10);
                      if (pCVar6 == (CollSeq *)0x0) {
                        pCVar6 = pParse->db->pDfltColl;
                      }
                      lVar8 = 0;
                      goto LAB_0019cf49;
                    }
                    break;
                  }
                  if ((pEVar3->flags >> 0x13 & 1) == 0) {
                    pEVar7 = (ExprList_item *)&pEVar3->pLeft;
                  }
                  else {
                    pEVar7 = ((pEVar3->x).pList)->a;
                  }
                  pEVar3 = pEVar7->pExpr;
                }
                goto LAB_0019cf72;
              }
              break;
            }
LAB_0019cfc0:
            uVar11 = uVar11 + 1;
          } while (uVar11 < pIdx->nKeyCol);
        }
LAB_0019cfe3:
        if ((uint)uVar11 == (uint)pIdx->nKeyCol) {
          return 1;
        }
      }
    }
  }
  return 0;
LAB_0019cf49:
  bVar12 = pCVar6->zName[lVar8];
  if (bVar12 == pcVar2[lVar8]) {
    if ((ulong)bVar12 == 0) {
      sVar1 = pIdx->aiColumn[uVar11];
      if ((long)sVar1 < 0) {
        bVar12 = sVar1 == -1;
      }
      else {
        bVar12 = pIdx->pTable->aCol[sVar1].field_0x8 & 0xf;
      }
      if (bVar12 == 0) goto LAB_0019cfe3;
      goto LAB_0019cfc0;
    }
  }
  else if (""[bVar12] != ""[(byte)pcVar2[lVar8]]) goto LAB_0019cf6b;
  lVar8 = lVar8 + 1;
  goto LAB_0019cf49;
LAB_0019cf6b:
  iVar4 = pDistinct->nExpr;
LAB_0019cf72:
  lVar9 = lVar9 + 1;
  if (iVar4 <= lVar9) goto LAB_0019cfe3;
  goto LAB_0019ceb9;
}

Assistant:

static int isDistinctRedundant(
  Parse *pParse,            /* Parsing context */
  SrcList *pTabList,        /* The FROM clause */
  WhereClause *pWC,         /* The WHERE clause */
  ExprList *pDistinct       /* The result set that needs to be DISTINCT */
){
  Table *pTab;
  Index *pIdx;
  int i;
  int iBase;

  /* If there is more than one table or sub-select in the FROM clause of
  ** this query, then it will not be possible to show that the DISTINCT
  ** clause is redundant. */
  if( pTabList->nSrc!=1 ) return 0;
  iBase = pTabList->a[0].iCursor;
  pTab = pTabList->a[0].pTab;

  /* If any of the expressions is an IPK column on table iBase, then return
  ** true. Note: The (p->iTable==iBase) part of this test may be false if the
  ** current SELECT is a correlated sub-query.
  */
  for(i=0; i<pDistinct->nExpr; i++){
    Expr *p = sqlite3ExprSkipCollateAndLikely(pDistinct->a[i].pExpr);
    if( NEVER(p==0) ) continue;
    if( p->op!=TK_COLUMN && p->op!=TK_AGG_COLUMN ) continue;
    if( p->iTable==iBase && p->iColumn<0 ) return 1;
  }

  /* Loop through all indices on the table, checking each to see if it makes
  ** the DISTINCT qualifier redundant. It does so if:
  **
  **   1. The index is itself UNIQUE, and
  **
  **   2. All of the columns in the index are either part of the pDistinct
  **      list, or else the WHERE clause contains a term of the form "col=X",
  **      where X is a constant value. The collation sequences of the
  **      comparison and select-list expressions must match those of the index.
  **
  **   3. All of those index columns for which the WHERE clause does not
  **      contain a "col=X" term are subject to a NOT NULL constraint.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( !IsUniqueIndex(pIdx) ) continue;
    if( pIdx->pPartIdxWhere ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( 0==sqlite3WhereFindTerm(pWC, iBase, i, ~(Bitmask)0, WO_EQ, pIdx) ){
        if( findIndexCol(pParse, pDistinct, iBase, pIdx, i)<0 ) break;
        if( indexColumnNotNull(pIdx, i)==0 ) break;
      }
    }
    if( i==pIdx->nKeyCol ){
      /* This index implies that the DISTINCT qualifier is redundant. */
      return 1;
    }
  }

  return 0;
}